

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingBuffer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_be1::RingBufferTest_Simple_Test::TestBody(RingBufferTest_Simple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Data_t *lhs;
  char *in_R9;
  string local_170;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  Data_t v;
  int i_2;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  int i_1;
  Message local_d0;
  bool local_c5;
  Data_t local_c4;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  Index_t local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  bool local_65;
  Data_t local_64;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_48 [4];
  int i;
  RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> rb;
  uint TEST_SIZE;
  RingBufferTest_Simple_Test *this_local;
  
  rb.bourn_ = 0x100;
  Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::RingBuffer
            ((RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> *)local_48,0x100);
  for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < 0x100;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    local_64 = gtest_ar.message_.ptr_._4_2_;
    local_61 = Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::push
                         ((RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> *)
                          local_48,&local_64);
    local_65 = true;
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_60,"rb.push(i)","true",&local_61,&local_65);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(local_80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x49,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  }
  local_9c = Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::length
                       ((RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> *)local_48)
  ;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_98,"rb.length()","TEST_SIZE",&local_9c,(uint *)&rb.bourn_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_c4 = 0;
  local_c1 = Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::push
                       ((RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> *)local_48,
                        &local_c4);
  local_c5 = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_c0,"rb.push(0)","false",&local_c1,&local_c5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff28,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff28);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  for (gtest_ar_3.message_.ptr_._4_4_ = 0; gtest_ar_3.message_.ptr_._4_4_ < 0x100;
      gtest_ar_3.message_.ptr_._4_4_ = gtest_ar_3.message_.ptr_._4_4_ + 1) {
    lhs = Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::operator[]
                    ((RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> *)local_48,
                     gtest_ar_3.message_.ptr_._4_4_);
    testing::internal::EqHelper<false>::Compare<unsigned_short,int>
              ((EqHelper<false> *)local_f0,"rb[i]","i",lhs,
               (int *)((long)&gtest_ar_3.message_.ptr_ + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x4d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff00,&local_f8)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff00);
      testing::Message::~Message(&local_f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  }
  for (gtest_ar_4.message_.ptr_._4_4_ = 0; gtest_ar_4.message_.ptr_._4_4_ < 0x100;
      gtest_ar_4.message_.ptr_._4_4_ = gtest_ar_4.message_.ptr_._4_4_ + 1) {
    gtest_ar_4.message_.ptr_._2_2_ =
         Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::pop
                   ((RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> *)local_48);
    testing::internal::EqHelper<false>::Compare<unsigned_short,int>
              ((EqHelper<false> *)local_118,"v","i",
               (unsigned_short *)((long)&gtest_ar_4.message_.ptr_ + 2),
               (int *)((long)&gtest_ar_4.message_.ptr_ + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x50,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  }
  local_139 = Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::isEmpty
                        ((RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> *)local_48
                        );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_138,(AssertionResult *)"rb.isEmpty()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::~RingBuffer
            ((RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> *)local_48);
  return;
}

Assistant:

TEST( RingBufferTest,  Simple )
	{
		constexpr unsigned TEST_SIZE = 256;
		RingBuffer<uint16_t> rb(TEST_SIZE);
		for( int i=0; i<TEST_SIZE ; ++i )
			EXPECT_EQ( rb.push(i), true );
		EXPECT_EQ( rb.length(), TEST_SIZE);
		EXPECT_EQ( rb.push(0), false );  // buffer overflow. failed to push
		for( int i=0; i<TEST_SIZE ; ++i )
			EXPECT_EQ( rb[i], i );
		for( int i=0; i<TEST_SIZE ; ++i ) {
			auto v = rb.pop(); 
			EXPECT_EQ( v, i);
		}
		EXPECT_TRUE( rb.isEmpty() );
	}